

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::verifyFloat
               (ResultCollector *result,QueriedState *state,float expected)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  ostringstream buf;
  string local_1d0;
  ostringstream local_1b0 [376];
  Enum<int,_1UL> local_38;
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if ((state->m_v).vBool == (expected != 0.0)) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar1 = std::operator<<((ostream *)local_1b0,"Expected ");
    local_1d0._M_string_length._0_4_ = -(uint)(expected != 0.0) & 1;
    local_1d0._M_dataplus._M_p = (pointer)glu::getBooleanName;
    poVar1 = tcu::Format::Enum<int,_1UL>::toStream((Enum<int,_1UL> *)&local_1d0,poVar1);
    poVar1 = std::operator<<(poVar1,", got ");
    local_38.m_getName = glu::getBooleanName;
    local_38.m_value = (int)(state->m_v).vBool;
    tcu::Format::Enum<int,_1UL>::toStream(&local_38,poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  case DATATYPE_INTEGER:
    fVar5 = ceilf(expected + -0.5);
    iVar2 = (int)fVar5;
    fVar5 = floorf(expected + 0.5);
    iVar4 = (int)fVar5;
    if ((state->m_v).vInt <= iVar4 && iVar2 <= (state->m_v).vInt) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    if (iVar2 == iVar4) {
      poVar1 = std::operator<<((ostream *)local_1b0,"Expected ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      pcVar3 = ", got ";
    }
    else {
      poVar1 = std::operator<<((ostream *)local_1b0,"Expected in range [");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
      pcVar3 = "], got ";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  case DATATYPE_INTEGER64:
    fVar5 = ceilf(expected + -0.5);
    fVar6 = floorf(expected + 0.5);
    if ((state->m_v).vInt64 <= (long)fVar6 && (long)fVar5 <= (state->m_v).vInt64) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    if ((long)fVar5 == (long)fVar6) {
      poVar1 = std::operator<<((ostream *)local_1b0,"Expected ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      pcVar3 = ", got ";
    }
    else {
      poVar1 = std::operator<<((ostream *)local_1b0,"Expected in range [");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      pcVar3 = "], got ";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  case DATATYPE_FLOAT:
    if (((state->m_v).vFloat == expected) && (!NAN((state->m_v).vFloat) && !NAN(expected))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar1 = std::operator<<((ostream *)local_1b0,"Expected ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,expected);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  case DATATYPE_UNSIGNED_INTEGER:
    fVar5 = ceilf(expected + -0.5);
    fVar6 = floorf(expected + 0.5);
    if ((state->m_v).vUint <= (uint)(long)fVar6 && (uint)(long)fVar5 <= (state->m_v).vUint) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    if ((uint)(long)fVar5 == (uint)(long)fVar6) {
      poVar1 = std::operator<<((ostream *)local_1b0,"Expected ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar3 = ", got ";
    }
    else {
      poVar1 = std::operator<<((ostream *)local_1b0,"Expected in range [");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar3 = "], got ";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  default:
    goto switchD_006bf821_default;
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
switchD_006bf821_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}